

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

NetlistVariableDeclaration * __thiscall
netlist::Netlist::addVariableDeclaration(Netlist *this,Symbol *symbol)

{
  NetlistVariableDeclaration *pNVar1;
  pointer *__ptr;
  string_view hierarchicalPath;
  string hierPath;
  NetlistVariableDeclaration *local_48;
  _Head_base<0UL,_netlist::NetlistNode_*,_false> local_40;
  string local_38;
  
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(&local_38,symbol);
  hierarchicalPath._M_str = local_38._M_dataplus._M_p;
  hierarchicalPath._M_len = local_38._M_string_length;
  pNVar1 = lookupVariable(this,hierarchicalPath);
  if (pNVar1 == (NetlistVariableDeclaration *)0x0) {
    std::make_unique<netlist::NetlistVariableDeclaration,slang::ast::Symbol_const&>
              ((Symbol *)&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_48->hierarchicalPath,&local_38);
    pNVar1 = local_48;
    local_48 = (NetlistVariableDeclaration *)0x0;
    local_40._M_head_impl = &pNVar1->super_NetlistNode;
    std::
    vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
    ::emplace_back<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>
              ((vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
                *)&(this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes,
               (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
               &local_40);
    if ((NetlistVariableDeclaration *)local_40._M_head_impl != (NetlistVariableDeclaration *)0x0) {
      (*(((NetlistNode *)
         &(local_40._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
        super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node[1])();
    }
    if (local_48 != (NetlistVariableDeclaration *)0x0) {
      (*(local_48->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.
        _vptr_Node[1])();
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return pNVar1;
}

Assistant:

NetlistVariableDeclaration& addVariableDeclaration(const ast::Symbol& symbol) {
        std::string hierPath = symbol.getHierarchicalPath();
        if (auto* result = lookupVariable(hierPath)) {
            DEBUG_PRINT("Variable declaration for {} already exists", hierPath);
            return *result;
        }
        else {
            auto nodePtr = std::make_unique<NetlistVariableDeclaration>(symbol);
            nodePtr->hierarchicalPath = hierPath;
            auto& node = nodePtr->as<NetlistVariableDeclaration>();
            nodes.push_back(std::move(nodePtr));
            DEBUG_PRINT("Add var decl {}\n", node.hierarchicalPath);
            return node;
        }
    }